

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O3

bool __thiscall
Json::OurReader::decodeUnicodeEscapeSequence
          (OurReader *this,Token *token,Location *current,Location end,uint *ret_unicode)

{
  char cVar1;
  char *pcVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  String local_40;
  
  if ((long)end - (long)*current < 4) {
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,"Bad unicode escape sequence in string: four digits expected.",""
              );
    addError(this,&local_40,token,*current);
LAB_0058d12f:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
    bVar3 = false;
  }
  else {
    uVar5 = 0;
    iVar6 = 4;
    pcVar2 = *current;
    do {
      *current = pcVar2 + 1;
      cVar1 = *pcVar2;
      iVar7 = (int)cVar1;
      iVar4 = uVar5 * 0x10;
      if ((byte)(cVar1 - 0x30U) < 10) {
        uVar5 = (iVar4 + iVar7) - 0x30;
      }
      else if ((byte)(cVar1 + 0x9fU) < 6) {
        uVar5 = (iVar4 + iVar7) - 0x57;
      }
      else {
        if (5 < (byte)(cVar1 + 0xbfU)) {
          local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_40,
                     "Bad unicode escape sequence in string: hexadecimal digit expected.","");
          addError(this,&local_40,token,*current);
          goto LAB_0058d12f;
        }
        uVar5 = (iVar4 + iVar7) - 0x37;
      }
      iVar6 = iVar6 + -1;
      pcVar2 = pcVar2 + 1;
    } while (iVar6 != 0);
    *ret_unicode = uVar5;
    bVar3 = true;
  }
  return bVar3;
}

Assistant:

bool OurReader::decodeUnicodeEscapeSequence(Token& token, Location& current,
                                            Location end,
                                            unsigned int& ret_unicode) {
  if (end - current < 4)
    return addError(
        "Bad unicode escape sequence in string: four digits expected.", token,
        current);
  int unicode = 0;
  for (int index = 0; index < 4; ++index) {
    Char c = *current++;
    unicode *= 16;
    if (c >= '0' && c <= '9')
      unicode += c - '0';
    else if (c >= 'a' && c <= 'f')
      unicode += c - 'a' + 10;
    else if (c >= 'A' && c <= 'F')
      unicode += c - 'A' + 10;
    else
      return addError(
          "Bad unicode escape sequence in string: hexadecimal digit expected.",
          token, current);
  }
  ret_unicode = static_cast<unsigned int>(unicode);
  return true;
}